

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

void __thiscall ON_ClippingPlaneSurface::Default(ON_ClippingPlaneSurface *this)

{
  long lVar1;
  ON_Plane *pOVar2;
  ON_ClippingPlane *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  pOVar2 = &ON_xy_plane;
  pOVar3 = &this->m_clipping_plane;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar3->m_plane).origin.x = (pOVar2->origin).x;
    pOVar2 = (ON_Plane *)&(pOVar2->origin).y;
    pOVar3 = (ON_ClippingPlane *)&(pOVar3->m_plane).origin.y;
  }
  ON_UuidList::Empty(&(this->m_clipping_plane).m_viewport_ids);
  (this->m_clipping_plane).m_plane_id.Data1 = 0;
  (this->m_clipping_plane).m_plane_id.Data2 = 0;
  (this->m_clipping_plane).m_plane_id.Data3 = 0;
  (this->m_clipping_plane).m_plane_id.Data4[0] = '\0';
  (this->m_clipping_plane).m_plane_id.Data4[1] = '\0';
  (this->m_clipping_plane).m_plane_id.Data4[2] = '\0';
  (this->m_clipping_plane).m_plane_id.Data4[3] = '\0';
  (this->m_clipping_plane).m_plane_id.Data4[4] = '\0';
  (this->m_clipping_plane).m_plane_id.Data4[5] = '\0';
  (this->m_clipping_plane).m_plane_id.Data4[6] = '\0';
  (this->m_clipping_plane).m_plane_id.Data4[7] = '\0';
  (this->m_clipping_plane).m_bEnabled = true;
  (this->m_clipping_plane).m_depth_enabled = false;
  (this->m_clipping_plane).m_participation_lists_enabled = false;
  DeleteClippingPlaneData(&(this->m_clipping_plane).m_data_store);
  pOVar3 = &this->m_clipping_plane;
  pOVar2 = &(this->super_ON_PlaneSurface).m_plane;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar2->origin).x = (pOVar3->m_plane).origin.x;
    pOVar3 = (ON_ClippingPlane *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
    pOVar2 = (ON_Plane *)((long)pOVar2 + (ulong)bVar4 * -0x10 + 8);
  }
  ON_Interval::Set((ON_Interval *)&(this->super_ON_PlaneSurface).field_0x90,0.0,1.0);
  ON_Interval::Set((ON_Interval *)&(this->super_ON_PlaneSurface).field_0xa0,0.0,1.0);
  ON_Interval::Set((ON_Interval *)&(this->super_ON_PlaneSurface).field_0xb0,-1.0,1.0);
  ON_Interval::Set((ON_Interval *)&(this->super_ON_PlaneSurface).field_0xc0,-1.0,1.0);
  return;
}

Assistant:

void ON_ClippingPlaneSurface::Default()
{
  m_clipping_plane.Default();
  m_plane = m_clipping_plane.m_plane;
  m_domain[0].Set(0.0,1.0);
  m_domain[1].Set(0.0,1.0);
  m_extents[0].Set(-1.0,1.0);
  m_extents[1].Set(-1.0,1.0);
}